

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_insert(upb_strtable *t,char *k,size_t len,upb_value v,upb_Arena *a)

{
  _Bool _Var1;
  uint32_t hash_00;
  upb_tabkey tabkey_00;
  lookupkey_t k2;
  char *local_68;
  size_t local_60;
  uint32_t hash;
  upb_tabkey tabkey;
  lookupkey_t key;
  upb_Arena *a_local;
  size_t len_local;
  char *k_local;
  upb_strtable *t_local;
  upb_value v_local;
  
  _Var1 = isfull(&t->t);
  if ((!_Var1) || (_Var1 = upb_strtable_resize(t,(long)(int)((t->t).size_lg2 + 1),a), _Var1)) {
    k2 = strkey2(k,len);
    local_68 = k2.str.str;
    local_60 = k2.str.len;
    tabkey_00 = strcopy(k2,a);
    if (tabkey_00 == 0) {
      v_local.val._7_1_ = false;
    }
    else {
      hash_00 = _upb_Hash_NoSeed(local_68,local_60);
      insert(&t->t,k2,tabkey_00,v,hash_00,strhash,streql);
      v_local.val._7_1_ = true;
    }
  }
  else {
    v_local.val._7_1_ = false;
  }
  return v_local.val._7_1_;
}

Assistant:

bool upb_strtable_insert(upb_strtable* t, const char* k, size_t len,
                         upb_value v, upb_Arena* a) {
  lookupkey_t key;
  upb_tabkey tabkey;
  uint32_t hash;

  if (isfull(&t->t)) {
    /* Need to resize.  New table of double the size, add old elements to it. */
    if (!upb_strtable_resize(t, t->t.size_lg2 + 1, a)) {
      return false;
    }
  }

  key = strkey2(k, len);
  tabkey = strcopy(key, a);
  if (tabkey == 0) return false;

  hash = _upb_Hash_NoSeed(key.str.str, key.str.len);
  insert(&t->t, key, tabkey, v, hash, &strhash, &streql);
  return true;
}